

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorGraph.hpp
# Opt level: O0

void __thiscall CoreML::LayerNode::LayerNode(LayerNode *this,LossLayer *lossLayer)

{
  LossLayerTypeCase LVar1;
  string *psVar2;
  CategoricalCrossEntropyLossLayer *this_00;
  MeanSquaredErrorLossLayer *this_01;
  LossLayer *lossLayer_local;
  LayerNode *this_local;
  
  std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>::vector(&this->parents);
  std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>::vector(&this->children);
  std::__cxx11::string::string((string *)&this->name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(this->name)._M_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->outputNames);
  psVar2 = Specification::LossLayer::name_abi_cxx11_(lossLayer);
  std::__cxx11::string::operator=((string *)&this->name,(string *)psVar2);
  LVar1 = Specification::LossLayer::LossLayerType_case(lossLayer);
  if (LVar1 == kCategoricalCrossEntropyLossLayer) {
    this_00 = Specification::LossLayer::categoricalcrossentropylosslayer(lossLayer);
    psVar2 = Specification::CategoricalCrossEntropyLossLayer::input_abi_cxx11_(this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(this->name)._M_storage,psVar2);
  }
  else if (LVar1 == kMeanSquaredErrorLossLayer) {
    this_01 = Specification::LossLayer::meansquarederrorlosslayer(lossLayer);
    psVar2 = Specification::MeanSquaredErrorLossLayer::input_abi_cxx11_(this_01);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(this->name)._M_storage,psVar2);
  }
  LVar1 = Specification::LossLayer::LossLayerType_case(lossLayer);
  this->lossLayerType = LVar1;
  this->layerType = LAYER_NOT_SET;
  this->isUpdatable = false;
  this->isBackPropagable = false;
  return;
}

Assistant:

LayerNode(const Specification::LossLayer *lossLayer)
    {
        name = lossLayer->name();

        switch (lossLayer->LossLayerType_case()) {
            case CoreML::Specification::LossLayer::kCategoricalCrossEntropyLossLayer:
                inputNames.push_back(lossLayer->categoricalcrossentropylosslayer().input());
                break;
            case CoreML::Specification::LossLayer::kMeanSquaredErrorLossLayer:
                inputNames.push_back(lossLayer->meansquarederrorlosslayer().input());
                break;
            default:
                break;
        }

        lossLayerType = lossLayer->LossLayerType_case();
        layerType = Specification::NeuralNetworkLayer::LAYER_NOT_SET;
        isUpdatable = false;
        isBackPropagable = false;
    }